

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
~ConcreteMachine(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this)

{
  ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this_local;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca5e50;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca5ed8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca5f20;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca5f38;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca5f68;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca5fa8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca5fc0;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca5ff8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca6010;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&(this->speaker_).queue);
  FloppyController::~FloppyController(&this->fdc_);
  KeyboardController::~KeyboardController(&this->keyboard_);
  MDA::~MDA(&this->video_);
  PCSpeaker::~PCSpeaker(&this->speaker_);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  PCCompatible::Machine::~Machine(&this->super_Machine);
  return;
}

Assistant:

~ConcreteMachine() {
			speaker_.queue.flush();
		}